

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_A.cpp
# Opt level: O1

void __thiscall A::~A(A *this)

{
  spin_mutex_t sVar1;
  long *plVar2;
  
  do {
    sVar1.lock_.super___atomic_flag_base._M_i = my_io_mutex.lock_.super___atomic_flag_base._M_i;
    LOCK();
    my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x1;
    UNLOCK();
  } while ((__atomic_flag_base)sVar1.lock_.super___atomic_flag_base._M_i != false);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Destroying A of sz=",0x13);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cerr,this->n_);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  if (this->a != (float *)0x0) {
    operator_delete__(this->a);
  }
  if (this->b != (float *)0x0) {
    operator_delete__(this->b);
  }
  if (this->c != (float *)0x0) {
    operator_delete__(this->c);
    return;
  }
  return;
}

Assistant:

~A() {
    LOG("Destroying A of sz=" << n_);
    delete [] a;
    delete [] b;
    delete [] c;
  }